

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O2

BinaryenExportRef
BinaryenAddTableExport(BinaryenModuleRef module,char *internalName,char *externalName)

{
  Export *curr;
  Name local_50;
  undefined8 local_40;
  undefined8 uStack_38;
  __index_type local_30;
  undefined4 local_2f;
  undefined3 uStack_2b;
  char *local_28;
  char *internalName_local;
  
  local_28 = internalName;
  curr = (Export *)operator_new(0x30);
  wasm::Name::Name(&local_50,externalName);
  std::__detail::__variant::_Variant_storage<true,wasm::Name,wasm::HeapType>::
  _Variant_storage<0ul,char_const*&>
            ((_Variant_storage<true,wasm::Name,wasm::HeapType> *)&local_40,&local_28);
  *(undefined8 *)
   &(curr->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
    super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
    super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
    super__Variant_storage_alias<wasm::Name,_wasm::HeapType>._M_u = local_40;
  *(undefined8 *)
   ((long)&(curr->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
           super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
           super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
           super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
           super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
           super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 8) = uStack_38;
  *(undefined4 *)
   ((long)&(curr->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
           super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
           super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
           super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
           super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
           super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x11) = local_2f;
  *(uint *)((long)&(curr->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
                   super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
                   super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
                   super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x14) =
       CONCAT31(uStack_2b,local_2f._3_1_);
  (curr->name).super_IString.str._M_len = local_50.super_IString.str._M_len;
  (curr->name).super_IString.str._M_str = local_50.super_IString.str._M_str;
  curr->kind = Table;
  *(__index_type *)
   ((long)&(curr->value).super__Variant_base<wasm::Name,_wasm::HeapType>.
           super__Move_assign_alias<wasm::Name,_wasm::HeapType>.
           super__Copy_assign_alias<wasm::Name,_wasm::HeapType>.
           super__Move_ctor_alias<wasm::Name,_wasm::HeapType>.
           super__Copy_ctor_alias<wasm::Name,_wasm::HeapType>.
           super__Variant_storage_alias<wasm::Name,_wasm::HeapType> + 0x10) = local_30;
  if (local_30 == '\0') {
    wasm::Module::addExport(module,curr);
    return curr;
  }
  __assert_fail("std::get_if<Name>(&value)",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/wasm.h"
                ,0x8e3,"wasm::Export::Export(Name, ExternalKind, std::variant<Name, HeapType>)");
}

Assistant:

BinaryenExportRef BinaryenAddTableExport(BinaryenModuleRef module,
                                         const char* internalName,
                                         const char* externalName) {
  auto* ret = new Export(externalName, ExternalKind::Table, internalName);
  ((Module*)module)->addExport(ret);
  return ret;
}